

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.c
# Opt level: O1

char * cp_enumerate(wchar_t index)

{
  int iVar1;
  char *pcVar2;
  
  iVar1 = charset_localenc_nth(index);
  if (iVar1 != 0) {
    pcVar2 = charset_to_localenc(iVar1);
    return pcVar2;
  }
  iVar1 = charset_localenc_nth(index + L'\xffffffff');
  pcVar2 = (char *)0x0;
  if (iVar1 != 0) {
    pcVar2 = "Use font encoding";
  }
  return pcVar2;
}

Assistant:

const char *cp_enumerate(int index)
{
    int charset;
    charset = charset_localenc_nth(index);
    if (charset == CS_NONE) {
        /* "Use font encoding" comes after all the named charsets */
        if (charset_localenc_nth(index-1) != CS_NONE)
            return "Use font encoding";
        return NULL;
    }
    return charset_to_localenc(charset);
}